

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O1

void __thiscall QRhiWidget::setFixedColorBufferSize(QRhiWidget *this,QSize pixelSize)

{
  long lVar1;
  long in_FS_OFFSET;
  bool bVar2;
  QSize local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  local_18 = pixelSize;
  if ((*(int *)(lVar1 + 0x27c) != pixelSize.wd.m_i.m_i) ||
     (local_18.ht = pixelSize.ht.m_i, bVar2 = *(int *)(lVar1 + 0x280) != local_18.ht.m_i, bVar2)) {
    *(QSize *)(lVar1 + 0x27c) = pixelSize;
    fixedColorBufferSizeChanged(this,&local_18);
    QWidget::update(&this->super_QWidget);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiWidget::setFixedColorBufferSize(QSize pixelSize)
{
    Q_D(QRhiWidget);
    if (d->fixedSize != pixelSize) {
        d->fixedSize = pixelSize;
        emit fixedColorBufferSizeChanged(pixelSize);
        update();
    }
}